

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O1

void DumpFunction(Proto *f,TString *psource,DumpState *D)

{
  TValue *pTVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong in_RAX;
  void *pvVar5;
  size_t sVar6;
  uint uVar7;
  lua_State *plVar8;
  ulong uVar9;
  long lVar10;
  lu_byte x;
  ulong local_38;
  
  if ((D->strip == 0) && (f->source != psource)) {
    local_38 = in_RAX;
    DumpString(f->source,D);
  }
  else {
    local_38 = in_RAX & 0xffffffffffffff00;
    if (D->status == 0) {
      iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
      D->status = iVar2;
    }
  }
  if (D->status == 0) {
    local_38._0_4_ = f->linedefined;
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  local_38 = CONCAT44(local_38._4_4_,f->lastlinedefined);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  if (D->status == 0) {
    local_38._0_1_ = f->numparams;
    iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
    D->status = iVar2;
  }
  local_38._0_1_ = f->is_vararg;
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
    D->status = iVar2;
  }
  local_38 = CONCAT71(local_38._1_7_,f->maxstacksize);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
    D->status = iVar2;
  }
  local_38 = CONCAT44(local_38._4_4_,f->sizecode);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  if (((long)f->sizecode != 0) && (D->status == 0)) {
    iVar2 = (*D->writer)(D->L,f->code,(long)f->sizecode << 2,D->data);
    D->status = iVar2;
  }
  uVar7 = f->sizek;
  local_38 = CONCAT44(local_38._4_4_,uVar7);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  if (0 < (int)uVar7) {
    lVar10 = 0;
    do {
      pTVar1 = f->k;
      local_38 = CONCAT71(local_38._1_7_,*(undefined1 *)((long)&pTVar1->tt_ + lVar10)) &
                 0xffffffffffffff3f;
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
      }
      uVar3 = *(uint *)((long)&pTVar1->tt_ + lVar10) & 0x3f;
      if (uVar3 < 4) {
        if (uVar3 == 1) {
          local_38 = CONCAT71(local_38._1_7_,*(undefined1 *)((long)&pTVar1->value_ + lVar10));
          if (D->status == 0) {
            plVar8 = D->L;
            pvVar5 = D->data;
            sVar6 = 1;
LAB_00108fc7:
            iVar2 = (*D->writer)(plVar8,&local_38,sVar6,pvVar5);
            D->status = iVar2;
          }
        }
        else if (uVar3 == 3) {
          local_38 = *(ulong *)((long)&pTVar1->value_ + lVar10);
          goto LAB_00108f99;
        }
      }
      else {
        if (uVar3 != 4) {
          if (uVar3 == 0x13) {
            local_38 = *(ulong *)((long)&pTVar1->value_ + lVar10);
LAB_00108f99:
            if (D->status == 0) {
              plVar8 = D->L;
              pvVar5 = D->data;
              sVar6 = 8;
              goto LAB_00108fc7;
            }
            goto LAB_00108fd0;
          }
          if (uVar3 != 0x14) goto LAB_00108fd0;
        }
        DumpString(*(TString **)((long)&pTVar1->value_ + lVar10),D);
      }
LAB_00108fd0:
      lVar10 = lVar10 + 0x10;
    } while ((ulong)uVar7 << 4 != lVar10);
  }
  uVar7 = f->sizeupvalues;
  local_38 = CONCAT44(local_38._4_4_,uVar7);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  if (0 < (int)uVar7) {
    lVar10 = 0;
    do {
      if (D->status == 0) {
        local_38._0_1_ = (&f->upvalues->instack)[lVar10];
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
      }
      local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->idx)[lVar10]);
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
      }
      lVar10 = lVar10 + 0x10;
    } while ((ulong)uVar7 << 4 != lVar10);
  }
  uVar7 = f->sizep;
  local_38 = CONCAT44(local_38._4_4_,uVar7);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  if (0 < (int)uVar7) {
    uVar9 = 0;
    do {
      DumpFunction(f->p[uVar9],f->source,D);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  iVar2 = 0;
  if (D->strip == 0) {
    iVar2 = f->sizelineinfo;
  }
  local_38 = CONCAT44(local_38._4_4_,iVar2);
  if (D->status == 0) {
    iVar4 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar4;
  }
  if ((iVar2 != 0) && (D->status == 0)) {
    iVar2 = (*D->writer)(D->L,f->lineinfo,(long)iVar2 << 2,D->data);
    D->status = iVar2;
  }
  uVar7 = 0;
  if (D->strip == 0) {
    uVar7 = f->sizelocvars;
  }
  local_38 = CONCAT44(local_38._4_4_,uVar7);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  if (0 < (int)uVar7) {
    lVar10 = 0;
    do {
      DumpString(*(TString **)((long)&f->locvars->varname + lVar10),D);
      if (D->status == 0) {
        local_38._0_4_ = *(undefined4 *)((long)&f->locvars->startpc + lVar10);
        iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
        D->status = iVar2;
      }
      local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)((long)&f->locvars->endpc + lVar10));
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
        D->status = iVar2;
      }
      lVar10 = lVar10 + 0x10;
    } while ((ulong)uVar7 << 4 != lVar10);
  }
  uVar7 = 0;
  if (D->strip == 0) {
    uVar7 = f->sizeupvalues;
  }
  local_38 = CONCAT44(local_38._4_4_,uVar7);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  if (0 < (int)uVar7) {
    lVar10 = 0;
    do {
      DumpString(*(TString **)((long)&f->upvalues->name + lVar10),D);
      lVar10 = lVar10 + 0x10;
    } while ((ulong)uVar7 << 4 != lVar10);
  }
  return;
}

Assistant:

static void DumpFunction (const Proto *f, TString *psource, DumpState *D) {
  if (D->strip || f->source == psource)
    DumpString(NULL, D);  /* no debug info or same source as its parent */
  else
    DumpString(f->source, D);
  DumpInt(f->linedefined, D);
  DumpInt(f->lastlinedefined, D);
  DumpByte(f->numparams, D);
  DumpByte(f->is_vararg, D);
  DumpByte(f->maxstacksize, D);
  DumpCode(f, D);
  DumpConstants(f, D);
  DumpUpvalues(f, D);
  DumpProtos(f, D);
  DumpDebug(f, D);
}